

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::reformat(QStatusBar *this)

{
  long lVar1;
  long lVar2;
  int size;
  int iVar3;
  QLayout *this_00;
  QLayout *layout;
  QSize QVar4;
  int extraout_var;
  long lVar5;
  Representation RVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QMargins local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long **)(lVar1 + 0x288) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x288) + 0x20))();
  }
  lVar5 = *(long *)(lVar1 + 0x298);
  this_00 = (QLayout *)operator_new(0x20);
  if (lVar5 == 0) {
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00,&this->super_QWidget);
    *(QLayout **)(lVar1 + 0x288) = this_00;
    local_48._0_8_ = 0;
    local_48.m_right.m_i = 0;
    local_48.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_48);
  }
  else {
    QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_00,&this->super_QWidget);
    *(QLayout **)(lVar1 + 0x288) = this_00;
    local_48._0_8_ = 0;
    local_48.m_right.m_i = 0;
    local_48.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_48);
    this_00 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00);
    QBoxLayout::addLayout(*(QBoxLayout **)(lVar1 + 0x288),this_00,0);
  }
  QBoxLayout::addSpacing((QBoxLayout *)this_00,3);
  layout = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)layout);
  QBoxLayout::addLayout((QBoxLayout *)this_00,layout,0);
  QBoxLayout::addSpacing((QBoxLayout *)layout,2);
  (**(code **)(*(long *)layout + 0x68))(layout,6);
  QWidget::fontMetrics((QWidget *)&local_48);
  size = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_48);
  uVar7 = 0;
  for (lVar5 = 0;
      (uVar7 < *(ulong *)(lVar1 + 0x268) &&
      (lVar2 = *(long *)(lVar1 + 0x260), *(int *)(lVar2 + 0xc + lVar5) != 1)); lVar5 = lVar5 + 0x10)
  {
    QBoxLayout::addWidget
              ((QBoxLayout *)layout,*(QWidget **)(lVar2 + lVar5),*(int *)(lVar2 + 8 + lVar5),
               (Alignment)0x0);
    QVar4 = qSmartMinSize(*(QWidget **)(lVar2 + lVar5));
    iVar3 = QWidget::maximumHeight(*(QWidget **)(lVar2 + lVar5));
    RVar6.m_i = QVar4.ht.m_i.m_i;
    if (iVar3 < QVar4.ht.m_i.m_i) {
      RVar6.m_i = iVar3;
    }
    if (RVar6.m_i < size) {
      RVar6.m_i = size;
    }
    size = RVar6.m_i;
    uVar7 = uVar7 + 1;
  }
  QBoxLayout::addStretch((QBoxLayout *)layout,0);
  for (; uVar7 < *(ulong *)(lVar1 + 0x268); uVar7 = uVar7 + 1) {
    lVar2 = *(long *)(lVar1 + 0x260);
    QBoxLayout::addWidget
              ((QBoxLayout *)layout,*(QWidget **)(lVar2 + lVar5),*(int *)(lVar2 + 8 + lVar5),
               (Alignment)0x0);
    QVar4 = qSmartMinSize(*(QWidget **)(lVar2 + lVar5));
    iVar3 = QWidget::maximumHeight(*(QWidget **)(lVar2 + lVar5));
    RVar6.m_i = QVar4.ht.m_i.m_i;
    if (iVar3 < QVar4.ht.m_i.m_i) {
      RVar6.m_i = iVar3;
    }
    if (RVar6.m_i < size) {
      RVar6.m_i = size;
    }
    size = RVar6.m_i;
    lVar5 = lVar5 + 0x10;
  }
  if (*(long **)(lVar1 + 0x298) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x298) + 0x70))();
    iVar3 = extraout_var;
    if (extraout_var < size) {
      iVar3 = size;
    }
    size = iVar3;
    QBoxLayout::addSpacing(*(QBoxLayout **)(lVar1 + 0x288),1);
    QBoxLayout::addWidget
              (*(QBoxLayout **)(lVar1 + 0x288),*(QWidget **)(lVar1 + 0x298),0,(Alignment)0x40);
  }
  QBoxLayout::addStrut((QBoxLayout *)layout,size);
  *(int *)(lVar1 + 0x2a4) = size;
  QBoxLayout::addSpacing((QBoxLayout *)this_00,2);
  QLayout::activate(*(QLayout **)(lVar1 + 0x288));
  QWidget::update(&this->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::reformat()
{
    Q_D(QStatusBar);
    if (d->box)
        delete d->box;

    QBoxLayout *vbox;
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        d->box = new QHBoxLayout(this);
        d->box->setContentsMargins(QMargins());
        vbox = new QVBoxLayout;
        d->box->addLayout(vbox);
    } else
#endif
    {
        vbox = d->box = new QVBoxLayout(this);
        d->box->setContentsMargins(QMargins());
    }
    vbox->addSpacing(3);
    QBoxLayout* l = new QHBoxLayout;
    vbox->addLayout(l);
    l->addSpacing(2);
    l->setSpacing(6);

    int maxH = fontMetrics().height();

    qsizetype i;
    for (i = 0; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        if (item.isPermanent())
            break;
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }

    l->addStretch(0);

    for (; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        maxH = qMax(maxH, d->resizer->sizeHint().height());
        d->box->addSpacing(1);
        d->box->addWidget(d->resizer, 0, Qt::AlignBottom);
    }
#endif
    l->addStrut(maxH);
    d->savedStrut = maxH;
    vbox->addSpacing(2);
    d->box->activate();
    update();
}